

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O3

void __thiscall
CCheckQueue<FakeCheckCheckCompletion>::Add
          (CCheckQueue<FakeCheckCheckCompletion> *this,
          vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *vChecks)

{
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  unique_lock<std::mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((vChecks->
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (vChecks->
      super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_28._M_owns = false;
    local_28._M_device = (mutex_type *)this;
    std::unique_lock<std::mutex>::lock(&local_28);
    std::vector<FakeCheckCheckCompletion,std::allocator<FakeCheckCheckCompletion>>::
    _M_range_insert<std::move_iterator<__gnu_cxx::__normal_iterator<FakeCheckCheckCompletion*,std::vector<FakeCheckCheckCompletion,std::allocator<FakeCheckCheckCompletion>>>>>
              ((vector<FakeCheckCheckCompletion,std::allocator<FakeCheckCheckCompletion>> *)
               &this->queue,
               (this->queue).
               super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (vChecks->
               super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
               )._M_impl.super__Vector_impl_data._M_start,
               (vChecks->
               super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    this->nTodo = this->nTodo +
                  (*(int *)&(vChecks->
                            super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                  *(int *)&(vChecks->
                           super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                           )._M_impl.super__Vector_impl_data._M_start);
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    if ((long)(vChecks->
              super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(vChecks->
              super__Vector_base<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
              )._M_impl.super__Vector_impl_data._M_start == 1) {
      std::condition_variable::notify_one();
    }
    else {
      std::condition_variable::notify_all();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!m_mutex)
    {
        if (vChecks.empty()) {
            return;
        }

        {
            LOCK(m_mutex);
            queue.insert(queue.end(), std::make_move_iterator(vChecks.begin()), std::make_move_iterator(vChecks.end()));
            nTodo += vChecks.size();
        }

        if (vChecks.size() == 1) {
            m_worker_cv.notify_one();
        } else {
            m_worker_cv.notify_all();
        }
    }